

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void writelog(char *str)

{
  FILE *__stream;
  char *in_RDI;
  char *LOG_FILE;
  FILE *log;
  
  __stream = fopen("./log.txt","a");
  if (__stream == (FILE *)0x0) {
    exit(1);
  }
  fputs(in_RDI,__stream);
  fclose(__stream);
  return;
}

Assistant:

void writelog(char *str)
{
	FILE *log;
	char *LOG_FILE = "./log.txt";
	if ((log = fopen(LOG_FILE, "a")) == NULL)
	{
		exit(EXIT_FAILURE);
	}
	fputs(str, log);
	fclose(log);
}